

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O3

void rsg::(anonymous_namespace)::convertValueRangeTempl<int,bool>
               (ConstValueRangeAccess src,ValueRangeAccess dst)

{
  int iVar1;
  
  iVar1 = (src.m_max)->intVal;
  (dst.super_ConstValueRangeAccess.m_min)->boolVal = (src.m_min)->intVal != 0;
  (dst.super_ConstValueRangeAccess.m_max)->boolVal = iVar1 != 0;
  return;
}

Assistant:

ConstValueAccess			getMin					(void) const	{ return ConstValueAccess(*m_type, m_min);	}